

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O2

void __thiscall
CGameContext::CreateDamage
          (CGameContext *this,vec2 Pos,int Id,vec2 Source,int HealthAmount,int ArmorAmount,bool Self
          )

{
  long lVar1;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  float fVar3;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_48;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_44;
  vec2 Source_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Source_local = Source;
  fVar3 = angle(&Source_local);
  puVar2 = (undefined8 *)CEventHandler::Create(&this->m_Events,0x16,0x1c,-1);
  if (puVar2 != (undefined8 *)0x0) {
    local_48 = Pos.field_0;
    aStack_44 = Pos.field_1;
    *puVar2 = CONCAT44((int)aStack_44.y,(int)local_48.x);
    *(int *)(puVar2 + 1) = Id;
    *(int *)((long)puVar2 + 0xc) = (int)(fVar3 * 256.0);
    *(int *)(puVar2 + 2) = HealthAmount;
    *(int *)((long)puVar2 + 0x14) = ArmorAmount;
    *(uint *)(puVar2 + 3) = (uint)Self;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameContext::CreateDamage(vec2 Pos, int Id, vec2 Source, int HealthAmount, int ArmorAmount, bool Self)
{
	float f = angle(Source);
	CNetEvent_Damage *pEvent = (CNetEvent_Damage *)m_Events.Create(NETEVENTTYPE_DAMAGE, sizeof(CNetEvent_Damage));
	if(pEvent)
	{
		pEvent->m_X = (int)Pos.x;
		pEvent->m_Y = (int)Pos.y;
		pEvent->m_ClientID = Id;
		pEvent->m_Angle = (int)(f*256.0f);
		pEvent->m_HealthAmount = HealthAmount;
		pEvent->m_ArmorAmount = ArmorAmount;
		pEvent->m_Self = Self;
	}
}